

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInterval.cpp
# Opt level: O0

void anon_unknown.dwarf_5b268::testCenter<int>(char *type)

{
  int iVar1;
  ostream *poVar2;
  char *in_RDI;
  Interval<int> b_1;
  int max;
  int min;
  Interval<int> b1;
  int p1;
  int p0;
  Interval<int> b0;
  Interval<int> b;
  Interval<int> local_40;
  int local_38 [2];
  Interval<int> local_30;
  int local_28;
  int local_24 [3];
  Interval<int> local_18;
  Interval<int> local_10;
  char *local_8;
  
  local_8 = in_RDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"    center() for type ");
  poVar2 = std::operator<<(poVar2,local_8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Interval<int>::Interval((Interval<int> *)0x16e932);
  iVar1 = Imath_3_2::Interval<int>::center(&local_10);
  if (iVar1 != 0) {
    __assert_fail("b.center () == T (0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x204,"void (anonymous namespace)::testCenter(const char *) [T = int]");
  }
  local_24[2] = 0xffffffff;
  local_24[1] = 1;
  Imath_3_2::Interval<int>::Interval(&local_18,local_24 + 2,local_24 + 1);
  iVar1 = Imath_3_2::Interval<int>::center(&local_18);
  if (iVar1 != 0) {
    __assert_fail("b0.center () == T (0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x20c,"void (anonymous namespace)::testCenter(const char *) [T = int]");
  }
  local_24[0] = 1;
  local_28 = 2;
  Imath_3_2::Interval<int>::Interval(&local_30,local_24,&local_28);
  iVar1 = Imath_3_2::Interval<int>::center(&local_30);
  if (iVar1 != (local_28 + local_24[0]) / 2) {
    __assert_fail("b1.center () == (p1 + p0) / 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x212,"void (anonymous namespace)::testCenter(const char *) [T = int]");
  }
  local_38[1] = 0;
  local_38[0] = 2;
  Imath_3_2::Interval<int>::Interval(&local_40,local_38 + 1,local_38);
  iVar1 = Imath_3_2::Interval<int>::center(&local_40);
  if (iVar1 == local_38[0] / 2) {
    return;
  }
  __assert_fail("b.center () == max / 2",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                ,0x21e,"void (anonymous namespace)::testCenter(const char *) [T = int]");
}

Assistant:

void
testCenter (const char* type)
{
    cout << "    center() for type " << type << endl;

    //
    // Center of empty interval.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b;
        assert (b.center () == T (0));
    }

    //
    // Center of non-empty, has-volume interval.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b0 (T (-1), T (1));
        assert (b0.center () == T (0));

        T p0 (1);
        T p1 (2);

        IMATH_INTERNAL_NAMESPACE::Interval<T> b1 (p0, p1);
        assert (b1.center () == (p1 + p0) / 2);
    }

    //
    // Center of non-empty, no-volume interval.
    //
    {
        T min (0);
        T max (2);

        IMATH_INTERNAL_NAMESPACE::Interval<T> b (min, max);

        assert (b.center () == max / 2);
    }
}